

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AArch64Disassembler.c
# Opt level: O3

DecodeStatus DecodeModImmInstruction(MCInst *Inst,uint32_t insn,uint64_t Addr,void *Decoder)

{
  uint uVar1;
  DecodeStatus DVar2;
  DecodeStatus extraout_EAX;
  uint *puVar3;
  ulong Val;
  
  uVar1 = MCInst_getOpcode(Inst);
  puVar3 = FPR128DecoderTable;
  if (uVar1 == 0x448) {
    puVar3 = FPR64DecoderTable;
  }
  MCOperand_CreateReg0(Inst,puVar3[insn & 0x1f]);
  MCOperand_CreateImm0(Inst,(ulong)(insn >> 5 & 0x1f | insn >> 0xb & 0xe0));
  uVar1 = MCInst_getOpcode(Inst);
  DVar2 = uVar1 - 1099;
  if (0x29 < DVar2) {
    return DVar2;
  }
  if ((0x2d00000004dU >> ((ulong)DVar2 & 0x3f) & 1) == 0) {
    if ((0x12000000012U >> ((ulong)DVar2 & 0x3f) & 1) == 0) {
      return DVar2;
    }
    Val = (ulong)(insn >> 9 & 8) + 0x108;
  }
  else {
    Val = (ulong)(insn >> 10 & 0x18);
  }
  MCOperand_CreateImm0(Inst,Val);
  return extraout_EAX;
}

Assistant:

static DecodeStatus DecodeModImmInstruction(MCInst *Inst, uint32_t insn,
		uint64_t Addr,
		void *Decoder)
{
	unsigned Rd = fieldFromInstruction(insn, 0, 5);
	unsigned cmode = fieldFromInstruction(insn, 12, 4);
	unsigned imm = fieldFromInstruction(insn, 16, 3) << 5;
	imm |= fieldFromInstruction(insn, 5, 5);

	if (MCInst_getOpcode(Inst) == AArch64_MOVID)
		DecodeFPR64RegisterClass(Inst, Rd, Addr, Decoder);
	else
		DecodeVectorRegisterClass(Inst, Rd, Addr, Decoder);

	MCOperand_CreateImm0(Inst, imm);

	switch (MCInst_getOpcode(Inst)) {
		default:
			break;
		case AArch64_MOVIv4i16:
		case AArch64_MOVIv8i16:
		case AArch64_MVNIv4i16:
		case AArch64_MVNIv8i16:
		case AArch64_MOVIv2i32:
		case AArch64_MOVIv4i32:
		case AArch64_MVNIv2i32:
		case AArch64_MVNIv4i32:
			MCOperand_CreateImm0(Inst, (cmode & 6) << 2);
			break;
		case AArch64_MOVIv2s_msl:
		case AArch64_MOVIv4s_msl:
		case AArch64_MVNIv2s_msl:
		case AArch64_MVNIv4s_msl:
			MCOperand_CreateImm0(Inst, cmode & 1 ? 0x110 : 0x108);
			break;
	}

	return Success;
}